

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layer_Dxx_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  bool *pbVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  int width;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  long lVar54;
  uint uVar55;
  int iVar56;
  int _a_1;
  int iVar57;
  int _a_3;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  float *data;
  long lVar62;
  int _a;
  int iVar63;
  uint uVar64;
  int iVar65;
  long lVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  int height;
  int _a_4;
  int data_width;
  int _a_2;
  
  pfVar6 = layer->response;
  pbVar7 = layer->laplacian;
  iVar1 = iimage->data_width;
  iVar2 = layer->step;
  lVar62 = (long)iVar2;
  iVar3 = layer->filter_size;
  uVar10 = iVar3 / 3;
  uVar13 = (iVar3 + -1) - (iVar3 + -1 >> 0x1f) >> 1;
  uVar11 = iVar3 / 6;
  iVar4 = layer->width;
  iVar20 = layer->height;
  fVar72 = 1.0 / (float)(iVar3 * iVar3);
  pfVar8 = iimage->data;
  iVar5 = iimage->width;
  uVar55 = ~uVar11;
  if (2 < iVar3) {
    iVar42 = uVar11 + iVar2;
    iVar14 = iVar42 - iVar42 % iVar2;
    iVar47 = iimage->height;
    iVar27 = (uVar10 - 1) * iVar1;
    iVar48 = uVar13 + iVar27;
    iVar49 = iVar2 * iVar1;
    iVar50 = uVar55 + uVar10 + iVar27;
    iVar63 = -(iVar42 % iVar2);
    iVar51 = iVar42 + uVar10 + uVar55 + iVar27;
    iVar15 = uVar55 + iVar27 + iVar42;
    iVar27 = iVar27 + iVar42 + uVar13;
    iVar46 = 0;
    do {
      iVar58 = (iVar46 / iVar2) * iVar4;
      iVar28 = iVar46 - uVar13;
      iVar38 = iVar28;
      if (iVar47 < iVar28) {
        iVar38 = iVar47;
      }
      iVar16 = iVar3 + iVar28;
      iVar19 = iVar47;
      if (iVar16 < iVar47) {
        iVar19 = iVar16;
      }
      iVar52 = (iVar38 + -1) * iVar1;
      iVar29 = (iVar19 + -1) * iVar1;
      iVar30 = iVar46 - uVar11;
      iVar44 = iVar30;
      if (iVar47 < iVar30) {
        iVar44 = iVar47;
      }
      iVar31 = iVar30 + uVar10;
      iVar25 = iVar47;
      if (iVar31 < iVar47) {
        iVar25 = iVar31;
      }
      iVar53 = (iVar44 + -1) * iVar1;
      iVar32 = (iVar25 + -1) * iVar1;
      iVar33 = iVar46 - uVar10;
      iVar45 = iVar33;
      if (iVar47 < iVar33) {
        iVar45 = iVar47;
      }
      iVar60 = iVar47;
      if (iVar46 < iVar47) {
        iVar60 = iVar46;
      }
      iVar34 = (iVar45 + -1) * iVar1;
      iVar35 = (iVar60 + -1) * iVar1;
      iVar36 = iVar46 + 1;
      iVar37 = iVar36;
      if (iVar47 < iVar36) {
        iVar37 = iVar47;
      }
      iVar61 = iVar46 + 1 + uVar10;
      if (iVar47 <= iVar61) {
        iVar61 = iVar47;
      }
      iVar22 = (iVar37 + -1) * iVar1;
      iVar23 = (iVar61 + -1) * iVar1;
      lVar54 = (long)iVar58;
      lVar66 = 0;
      do {
        iVar58 = iVar58 + 1;
        iVar18 = (int)lVar66;
        iVar59 = -uVar10 + 1 + iVar18;
        if (iVar5 < iVar59) {
          iVar59 = iVar5;
        }
        iVar56 = iVar59 + -1;
        iVar43 = uVar10 + iVar18;
        if (iVar5 <= (int)(uVar10 + iVar18)) {
          iVar43 = iVar5;
        }
        auVar73 = SUB6416(ZEXT464(0xc0400000),0);
        auVar70 = vfmadd213ss_fma(ZEXT416((uint)pfVar8[iVar50 + iVar18]),auVar73,
                                  ZEXT416((uint)pfVar8[iVar48 + iVar18]));
        fVar74 = 0.0;
        fVar76 = 0.0;
        if ((0 < iVar38) && (0 < iVar59)) {
          fVar76 = pfVar8[iVar52 + iVar56];
        }
        iVar17 = iVar43 + -1;
        if ((0 < iVar38) && (0 < iVar43)) {
          fVar74 = pfVar8[iVar52 + iVar17];
        }
        fVar75 = 0.0;
        fVar77 = 0.0;
        if ((0 < iVar19) && (0 < iVar59)) {
          fVar77 = pfVar8[iVar29 + iVar56];
        }
        if ((0 < iVar19) && (0 < iVar43)) {
          fVar75 = pfVar8[iVar29 + iVar17];
        }
        fVar78 = 0.0;
        if ((0 < iVar44) && (0 < iVar59)) {
          fVar78 = pfVar8[iVar53 + iVar56];
        }
        fVar79 = 0.0;
        if ((0 < iVar44) && (0 < iVar43)) {
          fVar79 = pfVar8[iVar53 + iVar17];
        }
        fVar80 = 0.0;
        fVar81 = 0.0;
        if ((0 < iVar25) && (0 < iVar59)) {
          fVar81 = pfVar8[iVar56 + iVar32];
        }
        if ((0 < iVar25) && (0 < iVar43)) {
          fVar80 = pfVar8[iVar17 + iVar32];
        }
        auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),
                            ZEXT816(0) << 0x40);
        iVar59 = iVar18 + 1;
        if (iVar5 < iVar18 + 1) {
          iVar59 = iVar5;
        }
        iVar56 = iVar59 + -1;
        iVar43 = iVar18 + 1 + uVar10;
        if (iVar5 <= iVar43) {
          iVar43 = iVar5;
        }
        fVar74 = 0.0;
        auVar67 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                             ZEXT816(0) << 0x40);
        auVar9 = vfmadd132ss_fma(auVar67,auVar9,auVar73);
        fVar76 = 0.0;
        if ((0 < iVar45) && (0 < iVar59)) {
          fVar76 = pfVar8[iVar34 + iVar56];
        }
        iVar17 = iVar43 + -1;
        if ((0 < iVar45) && (0 < iVar43)) {
          fVar74 = pfVar8[iVar34 + iVar17];
        }
        fVar75 = 0.0;
        fVar77 = 0.0;
        if ((0 < iVar60) && (0 < iVar59)) {
          fVar77 = pfVar8[iVar35 + iVar56];
        }
        if ((0 < iVar60) && (0 < iVar43)) {
          fVar75 = pfVar8[iVar35 + iVar17];
        }
        iVar40 = -uVar10 + iVar18;
        if (iVar5 < iVar40) {
          iVar40 = iVar5;
        }
        iVar24 = iVar40 + -1;
        iVar41 = iVar5;
        if (iVar18 < iVar5) {
          iVar41 = iVar18;
        }
        fVar78 = 0.0;
        if ((0 < iVar37) && (0 < iVar40)) {
          fVar78 = pfVar8[iVar22 + iVar24];
        }
        iVar18 = iVar41 + -1;
        fVar79 = 0.0;
        if ((0 < iVar37) && (0 < iVar41)) {
          fVar79 = pfVar8[iVar22 + iVar18];
        }
        fVar80 = 0.0;
        fVar81 = 0.0;
        if ((0 < iVar61) && (0 < iVar40)) {
          fVar81 = pfVar8[iVar23 + iVar24];
        }
        if ((0 < iVar61) && (0 < iVar41)) {
          fVar80 = pfVar8[iVar23 + iVar18];
        }
        auVar67 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar67);
        if ((0 < iVar45) && (0 < iVar40)) {
          in_ZMM16 = ZEXT464((uint)pfVar8[iVar34 + iVar24]);
        }
        auVar67 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar67);
        if ((0 < iVar45) && (0 < iVar41)) {
          in_ZMM17 = ZEXT464((uint)pfVar8[iVar34 + iVar18]);
        }
        auVar67 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar67);
        auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar67);
        if ((0 < iVar60) && (0 < iVar40)) {
          in_ZMM19 = ZEXT464((uint)pfVar8[iVar24 + iVar35]);
        }
        if (0 < iVar60 && 0 < iVar41) {
          in_ZMM18 = ZEXT464((uint)pfVar8[iVar18 + iVar35]);
        }
        auVar67 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar67);
        auVar68 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar68);
        if ((0 < iVar37) && (0 < iVar59)) {
          in_ZMM21 = ZEXT464((uint)pfVar8[iVar22 + iVar56]);
        }
        auVar68 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar68);
        if ((0 < iVar37) && (0 < iVar43)) {
          in_ZMM22 = ZEXT464((uint)pfVar8[iVar22 + iVar17]);
        }
        auVar68 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar68);
        auVar68 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        in_ZMM24 = ZEXT1664(auVar68);
        if ((0 < iVar61) && (0 < iVar59)) {
          in_ZMM24 = ZEXT464((uint)pfVar8[iVar56 + iVar23]);
        }
        if ((0 < iVar61) && (0 < iVar43)) {
          in_ZMM23 = ZEXT464((uint)pfVar8[iVar17 + iVar23]);
        }
        auVar68 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((fVar76 - fVar74) - fVar77))),
                             ZEXT816(0) << 0x40);
        auVar71 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                             ZEXT816(0) << 0x40);
        auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
        auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
        auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
        auVar69 = vmaxss_avx512f(auVar69,auVar67);
        auVar67 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
        auVar67 = vsubss_avx512f(auVar67,in_ZMM24._0_16_);
        auVar67 = vaddss_avx512f(auVar67,in_ZMM23._0_16_);
        auVar67 = vmaxss_avx(auVar67,ZEXT816(0) << 0x40);
        fVar76 = fVar72 * auVar70._0_4_;
        fVar74 = fVar72 * auVar9._0_4_;
        fVar77 = fVar72 * (((auVar68._0_4_ + auVar71._0_4_) - auVar69._0_4_) - auVar67._0_4_);
        auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77 * -0.81)),ZEXT416((uint)fVar76),
                                  ZEXT416((uint)fVar74));
        pfVar6[lVar54] = auVar70._0_4_;
        pbVar7[lVar54] = 0.0 <= fVar76 + fVar74;
        lVar54 = lVar54 + 1;
        lVar66 = lVar66 + lVar62;
      } while (lVar66 <= (long)(ulong)uVar11);
      if (iVar14 <= (int)uVar13) {
        iVar38 = iimage->height;
        if (iVar38 < iVar28) {
          iVar28 = iVar38;
        }
        if (iVar38 <= iVar16) {
          iVar16 = iVar38;
        }
        iVar44 = (iVar28 + -1) * iVar1;
        iVar19 = (iVar16 + -1) * iVar1;
        if (iVar38 < iVar30) {
          iVar30 = iVar38;
        }
        if (iVar38 <= iVar31) {
          iVar31 = iVar38;
        }
        iVar52 = (iVar30 + -1) * iVar1;
        iVar29 = (iVar31 + -1) * iVar1;
        if (iVar38 < iVar33) {
          iVar33 = iVar38;
        }
        iVar25 = iVar38;
        if (iVar46 < iVar38) {
          iVar25 = iVar46;
        }
        iVar45 = (iVar33 + -1) * iVar1;
        iVar32 = (iVar25 + -1) * iVar1;
        if (iVar38 < iVar36) {
          iVar36 = iVar38;
        }
        iVar53 = iVar46 + 1 + uVar10;
        if (iVar53 < iVar38) {
          iVar38 = iVar53;
        }
        iVar22 = (iVar36 + -1) * iVar1;
        iVar61 = (iVar38 + -1) * iVar1;
        pfVar21 = pfVar6 + iVar58;
        pbVar26 = pbVar7 + iVar58;
        lVar54 = (long)iVar14;
        iVar60 = iVar42 - uVar10;
        iVar37 = iVar42;
        iVar34 = iVar42 + uVar10;
        iVar35 = iVar27;
        iVar58 = iVar15;
        iVar53 = iVar51;
        do {
          iVar23 = iVar63 + 1 + iVar60;
          if (iVar5 < iVar23) {
            iVar23 = iVar5;
          }
          iVar18 = iVar23 + -1;
          iVar59 = iVar63 + iVar34;
          if (iVar5 <= iVar63 + iVar34) {
            iVar59 = iVar5;
          }
          fVar74 = 0.0;
          fVar76 = 0.0;
          if ((0 < iVar28) && (0 < iVar23)) {
            fVar76 = pfVar8[iVar44 + iVar18];
          }
          iVar43 = iVar59 + -1;
          if ((0 < iVar28) && (0 < iVar59)) {
            fVar74 = pfVar8[iVar44 + iVar43];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar16) && (0 < iVar23)) {
            fVar77 = pfVar8[iVar19 + iVar18];
          }
          if ((0 < iVar16) && (0 < iVar59)) {
            fVar75 = pfVar8[iVar19 + iVar43];
          }
          fVar78 = 0.0;
          if ((0 < iVar30) && (0 < iVar23)) {
            fVar78 = pfVar8[iVar52 + iVar18];
          }
          fVar79 = 0.0;
          if ((0 < iVar30) && (0 < iVar59)) {
            fVar79 = pfVar8[iVar52 + iVar43];
          }
          auVar70 = vfmadd213ss_fma(ZEXT416((uint)(pfVar8[iVar53 + iVar63] - pfVar8[iVar58 + iVar63]
                                                  )),auVar73,ZEXT416((uint)pfVar8[iVar63 + iVar35]))
          ;
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar31) && (0 < iVar23)) {
            fVar81 = pfVar8[iVar18 + iVar29];
          }
          if ((0 < iVar31) && (0 < iVar59)) {
            fVar80 = pfVar8[iVar43 + iVar29];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),
                              ZEXT816(0) << 0x40);
          iVar23 = iVar63 + 1 + iVar37;
          if (iVar5 < iVar23) {
            iVar23 = iVar5;
          }
          iVar18 = iVar23 + -1;
          iVar59 = iVar63 + 1 + iVar34;
          if (iVar5 <= iVar59) {
            iVar59 = iVar5;
          }
          fVar74 = 0.0;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar67,auVar9,auVar73);
          fVar76 = 0.0;
          if ((0 < iVar33) && (0 < iVar23)) {
            fVar76 = pfVar8[iVar45 + iVar18];
          }
          iVar43 = iVar59 + -1;
          if ((0 < iVar33) && (0 < iVar59)) {
            fVar74 = pfVar8[iVar45 + iVar43];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar25) && (0 < iVar23)) {
            fVar77 = pfVar8[iVar32 + iVar18];
          }
          if ((0 < iVar25) && (0 < iVar59)) {
            fVar75 = pfVar8[iVar32 + iVar43];
          }
          iVar56 = iVar63 + iVar60;
          if (iVar5 < iVar63 + iVar60) {
            iVar56 = iVar5;
          }
          iVar40 = iVar56 + -1;
          iVar17 = iVar63 + iVar37;
          if (iVar5 <= iVar63 + iVar37) {
            iVar17 = iVar5;
          }
          fVar78 = 0.0;
          if ((0 < iVar36) && (0 < iVar56)) {
            fVar78 = pfVar8[iVar22 + iVar40];
          }
          iVar41 = iVar17 + -1;
          fVar79 = 0.0;
          if ((0 < iVar36) && (0 < iVar17)) {
            fVar79 = pfVar8[iVar22 + iVar41];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar38) && (0 < iVar56)) {
            fVar81 = pfVar8[iVar61 + iVar40];
          }
          if ((0 < iVar38) && (0 < iVar17)) {
            fVar80 = pfVar8[iVar61 + iVar41];
          }
          auVar67 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar67);
          if ((0 < iVar33) && (0 < iVar56)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar45 + iVar40]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar67);
          if ((0 < iVar33) && (0 < iVar17)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar45 + iVar41]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar67);
          if ((0 < iVar25) && (0 < iVar56)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar40 + iVar32]);
          }
          if ((0 < iVar25) && (0 < iVar17)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar41 + iVar32]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          in_ZMM20 = ZEXT1664(auVar67);
          auVar68 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar68);
          if ((0 < iVar36) && (0 < iVar23)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar22 + iVar18]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar68);
          if ((0 < iVar36) && (0 < iVar59)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar22 + iVar43]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar68);
          auVar68 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar68);
          if ((0 < iVar38) && (0 < iVar23)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar18 + iVar61]);
          }
          if ((0 < iVar38) && (0 < iVar59)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar43 + iVar61]);
          }
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((fVar76 - fVar74) - fVar77))),
                               ZEXT816(0) << 0x40);
          auVar71 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
          auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
          auVar69 = vmaxss_avx512f(auVar69,auVar67);
          auVar67 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar67 = vsubss_avx512f(auVar67,in_ZMM24._0_16_);
          auVar67 = vaddss_avx512f(auVar67,in_ZMM23._0_16_);
          auVar67 = vmaxss_avx(auVar67,ZEXT816(0) << 0x40);
          fVar76 = fVar72 * auVar70._0_4_;
          fVar74 = fVar72 * auVar9._0_4_;
          fVar77 = fVar72 * (((auVar68._0_4_ + auVar71._0_4_) - auVar69._0_4_) - auVar67._0_4_);
          auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77 * -0.81)),ZEXT416((uint)fVar76),
                                    ZEXT416((uint)fVar74));
          *pfVar21 = auVar70._0_4_;
          *pbVar26 = 0.0 <= fVar76 + fVar74;
          lVar54 = lVar54 + lVar62;
          pfVar21 = pfVar21 + 1;
          pbVar26 = pbVar26 + 1;
          iVar34 = iVar34 + iVar2;
          iVar37 = iVar37 + iVar2;
          iVar60 = iVar60 + iVar2;
          iVar53 = iVar53 + iVar2;
          iVar58 = iVar58 + iVar2;
          iVar35 = iVar35 + iVar2;
        } while (lVar54 <= (int)uVar13);
      }
      iVar46 = iVar46 + iVar2;
      iVar48 = iVar48 + iVar49;
      iVar50 = iVar50 + iVar49;
      iVar51 = iVar51 + iVar49;
      iVar15 = iVar15 + iVar49;
      iVar27 = iVar27 + iVar49;
    } while (iVar46 < (int)uVar10);
  }
  iVar51 = (int)(uVar13 + iVar2) / iVar2;
  if (2 < iVar3) {
    iVar42 = iVar51 * iVar2;
    iVar14 = iVar4 * iVar2 - uVar13;
    iVar50 = (uVar10 - 1) * iVar1;
    iVar15 = uVar55 + uVar10 + iVar50;
    iVar46 = iVar2 * iVar1;
    iVar47 = (iVar50 + -1) - uVar11;
    iVar48 = (iVar50 + -1) - uVar13;
    iVar50 = iVar50 + uVar13;
    iVar27 = 0;
    auVar70 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    in_ZMM20 = ZEXT1664(auVar70);
    do {
      if (iVar42 < iVar14) {
        iVar58 = (iVar27 / iVar2) * iVar4 + iVar51;
        iVar38 = iVar27 - uVar13;
        iVar49 = iimage->height;
        iVar63 = iVar38;
        if (iVar49 < iVar38) {
          iVar63 = iVar49;
        }
        iVar28 = iVar38 + iVar3;
        if (iVar49 <= iVar38 + iVar3) {
          iVar28 = iVar49;
        }
        iVar19 = (iVar63 + -1) * iVar1;
        iVar16 = (iVar28 + -1) * iVar1;
        iVar44 = iVar27 - uVar11;
        iVar38 = iVar44;
        if (iVar49 < iVar44) {
          iVar38 = iVar49;
        }
        iVar30 = iVar44 + uVar10;
        if (iVar49 <= (int)(iVar44 + uVar10)) {
          iVar30 = iVar49;
        }
        iVar29 = (iVar38 + -1) * iVar1;
        iVar52 = (iVar30 + -1) * iVar1;
        iVar44 = iVar27 - uVar10;
        if (iVar49 < (int)(iVar27 - uVar10)) {
          iVar44 = iVar49;
        }
        iVar25 = iVar49;
        if (iVar27 < iVar49) {
          iVar25 = iVar27;
        }
        iVar45 = (iVar44 + -1) * iVar1;
        iVar33 = (iVar25 + -1) * iVar1;
        iVar31 = iVar27 + 1;
        if (iVar49 < iVar27 + 1) {
          iVar31 = iVar49;
        }
        iVar32 = iVar27 + 1 + uVar10;
        if (iVar32 < iVar49) {
          iVar49 = iVar32;
        }
        iVar36 = (iVar31 + -1) * iVar1;
        iVar34 = (iVar49 + -1) * iVar1;
        pfVar21 = pfVar6 + iVar58;
        pbVar26 = pbVar7 + iVar58;
        iVar35 = 0;
        lVar54 = (long)iVar42;
        iVar60 = -uVar10;
        iVar58 = iVar48;
        iVar32 = iVar47;
        iVar53 = iVar15;
        uVar64 = uVar10;
        iVar37 = iVar50;
        do {
          iVar61 = iVar42 + 1 + iVar60;
          if (iVar5 < iVar61) {
            iVar61 = iVar5;
          }
          iVar23 = iVar61 + -1;
          iVar22 = iVar42 + uVar64;
          if (iVar5 <= (int)(iVar42 + uVar64)) {
            iVar22 = iVar5;
          }
          auVar73 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[iVar42 + iVar53] - pfVar8[iVar42 + iVar32]
                                                  )),
                                    ZEXT416((uint)(pfVar8[iVar42 + iVar37] - pfVar8[iVar42 + iVar58]
                                                  )),SUB6416(ZEXT464(0xc0400000),0));
          fVar74 = 0.0;
          fVar76 = 0.0;
          if ((0 < iVar63) && (0 < iVar61)) {
            fVar76 = pfVar8[iVar19 + iVar23];
          }
          iVar59 = iVar22 + -1;
          if ((0 < iVar63) && (0 < iVar22)) {
            fVar74 = pfVar8[iVar19 + iVar59];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar28) && (0 < iVar61)) {
            fVar77 = pfVar8[iVar16 + iVar23];
          }
          if ((0 < iVar28) && (0 < iVar22)) {
            fVar75 = pfVar8[iVar16 + iVar59];
          }
          fVar78 = 0.0;
          if ((0 < iVar38) && (0 < iVar61)) {
            fVar78 = pfVar8[iVar29 + iVar23];
          }
          fVar79 = 0.0;
          if ((0 < iVar38) && (0 < iVar22)) {
            fVar79 = pfVar8[iVar29 + iVar59];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar30) && (0 < iVar61)) {
            fVar81 = pfVar8[iVar23 + iVar52];
          }
          if ((0 < iVar30) && (0 < iVar22)) {
            fVar80 = pfVar8[iVar59 + iVar52];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),
                              ZEXT816(0) << 0x40);
          iVar61 = iVar42 + 1 + iVar35;
          if (iVar5 < iVar61) {
            iVar61 = iVar5;
          }
          iVar23 = iVar61 + -1;
          iVar22 = iVar42 + 1 + uVar64;
          if (iVar5 <= iVar22) {
            iVar22 = iVar5;
          }
          fVar74 = 0.0;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar67,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar76 = 0.0;
          if ((0 < iVar44) && (0 < iVar61)) {
            fVar76 = pfVar8[iVar45 + iVar23];
          }
          iVar59 = iVar22 + -1;
          if ((0 < iVar44) && (0 < iVar22)) {
            fVar74 = pfVar8[iVar45 + iVar59];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar25) && (0 < iVar61)) {
            fVar77 = pfVar8[iVar33 + iVar23];
          }
          if ((0 < iVar25) && (0 < iVar22)) {
            fVar75 = pfVar8[iVar33 + iVar59];
          }
          iVar18 = iVar42 + iVar60;
          if (iVar5 < iVar42 + iVar60) {
            iVar18 = iVar5;
          }
          iVar56 = iVar18 + -1;
          iVar43 = iVar42 + iVar35;
          if (iVar5 <= iVar42 + iVar35) {
            iVar43 = iVar5;
          }
          fVar78 = 0.0;
          if ((0 < iVar31) && (0 < iVar18)) {
            fVar78 = pfVar8[iVar36 + iVar56];
          }
          iVar17 = iVar43 + -1;
          fVar79 = 0.0;
          if ((0 < iVar31) && (0 < iVar43)) {
            fVar79 = pfVar8[iVar36 + iVar17];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar49) && (0 < iVar18)) {
            fVar81 = pfVar8[iVar34 + iVar56];
          }
          if ((0 < iVar49) && (0 < iVar43)) {
            fVar80 = pfVar8[iVar34 + iVar17];
          }
          auVar67 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar67);
          if ((0 < iVar44) && (0 < iVar18)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar45 + iVar56]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar67);
          if ((0 < iVar44) && (0 < iVar43)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar45 + iVar17]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar67);
          if ((0 < iVar25) && (0 < iVar18)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar56 + iVar33]);
          }
          if ((0 < iVar25) && (0 < iVar43)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar17 + iVar33]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar67);
          if ((0 < iVar31) && (0 < iVar61)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar36 + iVar23]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar67);
          if ((0 < iVar31) && (0 < iVar22)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar36 + iVar59]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar67);
          if ((0 < iVar49) && (0 < iVar61)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar23 + iVar34]);
          }
          if ((0 < iVar49) && (0 < iVar22)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar59 + iVar34]);
          }
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((fVar76 - fVar74) - fVar77))),
                               ZEXT816(0) << 0x40);
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar71 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar71 = vsubss_avx512f(auVar71,in_ZMM19._0_16_);
          auVar71 = vaddss_avx512f(auVar71,in_ZMM18._0_16_);
          auVar69 = vmaxss_avx512f(auVar71,auVar70);
          auVar71 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar71 = vsubss_avx512f(auVar71,in_ZMM24._0_16_);
          auVar71 = vaddss_avx512f(auVar71,in_ZMM23._0_16_);
          auVar71 = vmaxss_avx(auVar71,ZEXT816(0) << 0x40);
          fVar76 = fVar72 * auVar73._0_4_;
          fVar74 = fVar72 * auVar9._0_4_;
          fVar77 = fVar72 * (((auVar67._0_4_ + auVar68._0_4_) - auVar69._0_4_) - auVar71._0_4_);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77 * -0.81)),ZEXT416((uint)fVar76),
                                    ZEXT416((uint)fVar74));
          *pfVar21 = auVar73._0_4_;
          *pbVar26 = 0.0 <= fVar76 + fVar74;
          lVar54 = lVar54 + lVar62;
          pfVar21 = pfVar21 + 1;
          pbVar26 = pbVar26 + 1;
          uVar64 = uVar64 + iVar2;
          iVar35 = iVar35 + iVar2;
          iVar60 = iVar60 + iVar2;
          iVar53 = iVar53 + iVar2;
          iVar32 = iVar32 + iVar2;
          iVar58 = iVar58 + iVar2;
          iVar37 = iVar37 + iVar2;
        } while (lVar54 < iVar14);
      }
      iVar27 = iVar27 + iVar2;
      iVar15 = iVar15 + iVar46;
      iVar47 = iVar47 + iVar46;
      iVar48 = iVar48 + iVar46;
      iVar50 = iVar50 + iVar46;
    } while (iVar27 < (int)uVar10);
  }
  auVar70 = in_ZMM20._0_16_;
  iVar15 = iVar4 * iVar2;
  iVar51 = (int)(~uVar13 + iVar2 + iVar15) / iVar2;
  if (2 < iVar3) {
    iVar38 = iVar15 - uVar11;
    iVar47 = iVar38 + iVar2 + -1;
    iVar49 = iVar47 % iVar2;
    iVar47 = iVar47 - iVar49;
    iVar14 = iVar51 * iVar2;
    iVar58 = uVar10 - 1;
    iVar42 = -uVar10;
    iVar27 = iVar1 * iVar58;
    iVar63 = uVar55 + uVar10 + iVar27;
    iVar46 = iVar2 * iVar1;
    iVar48 = (iVar27 + -1) - uVar11;
    iVar28 = (iVar27 + -1) - uVar13;
    iVar50 = iVar27 - uVar13;
    iVar27 = iVar27 - uVar11;
    uVar39 = 0;
    do {
      iVar19 = (int)uVar39;
      iVar16 = (int)((long)((ulong)(uint)(iVar19 >> 0x1f) << 0x20 | uVar39 & 0xffffffff) /
                    (long)iVar2) * iVar4 + iVar51;
      auVar70 = SUB6416(ZEXT464(0xc0400000),0);
      if (iVar14 < iVar38) {
        iVar29 = iVar19 - uVar13;
        iVar44 = iimage->height;
        iVar30 = iVar29;
        if (iVar44 < iVar29) {
          iVar30 = iVar44;
        }
        iVar52 = iVar29 + iVar3;
        if (iVar44 <= iVar29 + iVar3) {
          iVar52 = iVar44;
        }
        iVar25 = (iVar30 + -1) * iVar1;
        iVar45 = (iVar52 + -1) * iVar1;
        iVar31 = iVar19 - uVar11;
        iVar29 = iVar31;
        if (iVar44 < iVar31) {
          iVar29 = iVar44;
        }
        iVar33 = iVar31 + uVar10;
        if (iVar44 <= (int)(iVar31 + uVar10)) {
          iVar33 = iVar44;
        }
        iVar53 = (iVar29 + -1) * iVar1;
        iVar32 = (iVar33 + -1) * iVar1;
        iVar31 = iVar19 - uVar10;
        if (iVar44 < (int)(iVar19 - uVar10)) {
          iVar31 = iVar44;
        }
        iVar60 = iVar44;
        if (iVar19 < iVar44) {
          iVar60 = iVar19;
        }
        iVar36 = (iVar31 + -1) * iVar1;
        iVar34 = (iVar60 + -1) * iVar1;
        iVar37 = iVar19 + 1;
        if (iVar44 < iVar19 + 1) {
          iVar37 = iVar44;
        }
        iVar35 = uVar10 + 1 + iVar19;
        if (iVar35 < iVar44) {
          iVar44 = iVar35;
        }
        iVar59 = (iVar37 + -1) * iVar1;
        iVar18 = (iVar44 + -1) * iVar1;
        pfVar21 = pfVar6 + iVar16;
        pbVar26 = pbVar7 + iVar16;
        iVar43 = 0;
        lVar54 = (long)iVar14;
        iVar35 = iVar28;
        iVar61 = iVar48;
        uVar55 = uVar10;
        iVar22 = iVar42;
        iVar23 = iVar63;
        do {
          iVar56 = iVar14 + 1 + iVar22;
          if (iVar5 < iVar56) {
            iVar56 = iVar5;
          }
          iVar40 = iVar56 + -1;
          iVar17 = iVar14 + uVar55;
          if (iVar5 <= (int)(iVar14 + uVar55)) {
            iVar17 = iVar5;
          }
          auVar73 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[iVar14 + iVar23] - pfVar8[iVar61 + iVar14]
                                                  )),
                                    ZEXT416((uint)(pfVar8[(long)((iVar58 + iVar19) * iVar1 + iVar5)
                                                          + -1] - pfVar8[iVar14 + iVar35])),auVar70)
          ;
          fVar74 = 0.0;
          fVar76 = 0.0;
          if ((0 < iVar30) && (0 < iVar56)) {
            fVar76 = pfVar8[iVar25 + iVar40];
          }
          iVar41 = iVar17 + -1;
          if ((0 < iVar30) && (0 < iVar17)) {
            fVar74 = pfVar8[iVar25 + iVar41];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar52) && (0 < iVar56)) {
            fVar77 = pfVar8[iVar45 + iVar40];
          }
          if ((0 < iVar52) && (0 < iVar17)) {
            fVar75 = pfVar8[iVar45 + iVar41];
          }
          fVar78 = 0.0;
          if ((0 < iVar29) && (0 < iVar56)) {
            fVar78 = pfVar8[iVar53 + iVar40];
          }
          fVar79 = 0.0;
          if ((0 < iVar29) && (0 < iVar17)) {
            fVar79 = pfVar8[iVar53 + iVar41];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar33) && (0 < iVar56)) {
            fVar81 = pfVar8[iVar40 + iVar32];
          }
          if ((0 < iVar33) && (0 < iVar17)) {
            fVar80 = pfVar8[iVar41 + iVar32];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),
                              ZEXT816(0) << 0x40);
          iVar56 = iVar14 + 1 + iVar43;
          if (iVar5 < iVar56) {
            iVar56 = iVar5;
          }
          iVar40 = iVar56 + -1;
          iVar17 = iVar14 + 1 + uVar55;
          if (iVar5 <= iVar17) {
            iVar17 = iVar5;
          }
          fVar74 = 0.0;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar67,auVar9,auVar70);
          fVar76 = 0.0;
          if ((0 < iVar31) && (0 < iVar56)) {
            fVar76 = pfVar8[iVar36 + iVar40];
          }
          iVar41 = iVar17 + -1;
          if ((0 < iVar31) && (0 < iVar17)) {
            fVar74 = pfVar8[iVar36 + iVar41];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar60) && (0 < iVar56)) {
            fVar77 = pfVar8[iVar34 + iVar40];
          }
          if ((0 < iVar60) && (0 < iVar17)) {
            fVar75 = pfVar8[iVar34 + iVar41];
          }
          iVar24 = iVar14 + iVar22;
          if (iVar5 < iVar14 + iVar22) {
            iVar24 = iVar5;
          }
          iVar57 = iVar24 + -1;
          iVar12 = iVar14 + iVar43;
          if (iVar5 <= iVar14 + iVar43) {
            iVar12 = iVar5;
          }
          fVar78 = 0.0;
          if ((0 < iVar37) && (0 < iVar24)) {
            fVar78 = pfVar8[iVar59 + iVar57];
          }
          iVar65 = iVar12 + -1;
          fVar79 = 0.0;
          if ((0 < iVar37) && (0 < iVar12)) {
            fVar79 = pfVar8[iVar59 + iVar65];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar44) && (0 < iVar24)) {
            fVar81 = pfVar8[iVar18 + iVar57];
          }
          if ((0 < iVar44) && (0 < iVar12)) {
            fVar80 = pfVar8[iVar18 + iVar65];
          }
          auVar67 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar67);
          if ((0 < iVar31) && (0 < iVar24)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar36 + iVar57]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar67);
          if ((0 < iVar31) && (0 < iVar12)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar36 + iVar65]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar67);
          if ((0 < iVar60) && (0 < iVar24)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar57 + iVar34]);
          }
          if ((0 < iVar60) && (0 < iVar12)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar65 + iVar34]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          in_ZMM20 = ZEXT1664(auVar67);
          auVar68 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar68);
          if ((0 < iVar37) && (0 < iVar56)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar59 + iVar40]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar68);
          if ((0 < iVar37) && (0 < iVar17)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar59 + iVar41]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar68);
          auVar68 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar68);
          if ((0 < iVar44) && (0 < iVar56)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar40 + iVar18]);
          }
          if ((0 < iVar44) && (0 < iVar17)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar41 + iVar18]);
          }
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((fVar76 - fVar74) - fVar77))),
                               ZEXT816(0) << 0x40);
          auVar71 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
          auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
          auVar69 = vmaxss_avx512f(auVar69,auVar67);
          auVar67 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar67 = vsubss_avx512f(auVar67,in_ZMM24._0_16_);
          auVar67 = vaddss_avx512f(auVar67,in_ZMM23._0_16_);
          auVar67 = vmaxss_avx(auVar67,ZEXT816(0) << 0x40);
          fVar76 = fVar72 * auVar73._0_4_;
          fVar74 = fVar72 * auVar9._0_4_;
          fVar77 = fVar72 * (((auVar68._0_4_ + auVar71._0_4_) - auVar69._0_4_) - auVar67._0_4_);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77 * -0.81)),ZEXT416((uint)fVar76),
                                    ZEXT416((uint)fVar74));
          *pfVar21 = auVar73._0_4_;
          *pbVar26 = 0.0 <= fVar76 + fVar74;
          lVar54 = lVar54 + lVar62;
          pfVar21 = pfVar21 + 1;
          pbVar26 = pbVar26 + 1;
          iVar16 = iVar16 + 1;
          uVar55 = uVar55 + iVar2;
          iVar43 = iVar43 + iVar2;
          iVar22 = iVar22 + iVar2;
          iVar23 = iVar23 + iVar2;
          iVar61 = iVar61 + iVar2;
          iVar35 = iVar35 + iVar2;
        } while (lVar54 < iVar38);
      }
      if (iVar47 < iVar15) {
        iVar29 = iVar19 - uVar13;
        iVar44 = iimage->height;
        iVar30 = iVar29;
        if (iVar44 < iVar29) {
          iVar30 = iVar44;
        }
        iVar52 = iVar29 + iVar3;
        if (iVar44 <= iVar29 + iVar3) {
          iVar52 = iVar44;
        }
        iVar25 = (iVar30 + -1) * iVar1;
        iVar31 = (iVar52 + -1) * iVar1;
        iVar45 = iVar19 - uVar11;
        iVar29 = iVar45;
        if (iVar44 < iVar45) {
          iVar29 = iVar44;
        }
        iVar33 = iVar45 + uVar10;
        if (iVar44 <= (int)(iVar45 + uVar10)) {
          iVar33 = iVar44;
        }
        iVar53 = (iVar29 + -1) * iVar1;
        iVar32 = (iVar33 + -1) * iVar1;
        iVar45 = iVar19 - uVar10;
        if (iVar44 < (int)(iVar19 - uVar10)) {
          iVar45 = iVar44;
        }
        iVar60 = iVar44;
        if (iVar19 < iVar44) {
          iVar60 = iVar19;
        }
        iVar34 = (iVar45 + -1) * iVar1;
        iVar36 = (iVar60 + -1) * iVar1;
        iVar37 = iVar19 + 1;
        if (iVar44 < iVar19 + 1) {
          iVar37 = iVar44;
        }
        iVar35 = uVar10 + 1 + iVar19;
        if (iVar35 < iVar44) {
          iVar44 = iVar35;
        }
        iVar35 = (iVar37 + -1) * iVar1;
        iVar61 = (iVar44 + -1) * iVar1;
        lVar66 = (long)iVar16;
        lVar54 = (long)iVar47;
        iVar16 = (iVar38 + iVar2) - iVar49;
        do {
          iVar22 = iVar42 + iVar16;
          if (iVar5 < iVar42 + iVar16) {
            iVar22 = iVar5;
          }
          iVar59 = iVar22 + -1;
          iVar23 = iVar58 + iVar16;
          if (iVar5 <= iVar58 + iVar16) {
            iVar23 = iVar5;
          }
          auVar73 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[(long)((iVar58 + iVar19) * iVar1 + iVar5)
                                                          + -1] - pfVar8[iVar27 + -2 + iVar16])),
                                    ZEXT416((uint)(pfVar8[(long)((iVar58 + iVar19) * iVar1 + iVar5)
                                                          + -1] - pfVar8[iVar50 + -2 + iVar16])),
                                    auVar70);
          fVar74 = 0.0;
          fVar76 = 0.0;
          if ((0 < iVar30) && (0 < iVar22)) {
            fVar76 = pfVar8[iVar25 + iVar59];
          }
          iVar18 = iVar23 + -1;
          if ((0 < iVar30) && (0 < iVar23)) {
            fVar74 = pfVar8[iVar25 + iVar18];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar52) && (0 < iVar22)) {
            fVar77 = pfVar8[iVar31 + iVar59];
          }
          if ((0 < iVar52) && (0 < iVar23)) {
            fVar75 = pfVar8[iVar31 + iVar18];
          }
          fVar78 = 0.0;
          if ((0 < iVar29) && (0 < iVar22)) {
            fVar78 = pfVar8[iVar53 + iVar59];
          }
          fVar79 = 0.0;
          if ((0 < iVar29) && (0 < iVar23)) {
            fVar79 = pfVar8[iVar53 + iVar18];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar33) && (0 < iVar22)) {
            fVar81 = pfVar8[iVar59 + iVar32];
          }
          if ((0 < iVar33) && (0 < iVar23)) {
            fVar80 = pfVar8[iVar18 + iVar32];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),
                              ZEXT816(0) << 0x40);
          iVar22 = iVar16;
          if (iVar5 < iVar16) {
            iVar22 = iVar5;
          }
          iVar59 = iVar22 + -1;
          iVar23 = uVar10 + iVar16;
          if (iVar5 <= (int)(uVar10 + iVar16)) {
            iVar23 = iVar5;
          }
          fVar74 = 0.0;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar67,auVar9,auVar70);
          fVar76 = 0.0;
          if ((0 < iVar45) && (0 < iVar22)) {
            fVar76 = pfVar8[iVar34 + iVar59];
          }
          iVar18 = iVar23 + -1;
          if ((0 < iVar45) && (0 < iVar23)) {
            fVar74 = pfVar8[iVar34 + iVar18];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar60) && (0 < iVar22)) {
            fVar77 = pfVar8[iVar36 + iVar59];
          }
          if ((0 < iVar60) && (0 < iVar23)) {
            fVar75 = pfVar8[iVar36 + iVar18];
          }
          iVar43 = iVar16 + -1 + iVar42;
          if (iVar5 < iVar43) {
            iVar43 = iVar5;
          }
          iVar17 = iVar43 + -1;
          iVar56 = iVar16 + -1;
          if (iVar5 <= iVar16 + -1) {
            iVar56 = iVar5;
          }
          fVar78 = 0.0;
          if ((0 < iVar37) && (0 < iVar43)) {
            fVar78 = pfVar8[iVar35 + iVar17];
          }
          iVar40 = iVar56 + -1;
          fVar79 = 0.0;
          if ((0 < iVar37) && (0 < iVar56)) {
            fVar79 = pfVar8[iVar35 + iVar40];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar44) && (0 < iVar43)) {
            fVar81 = pfVar8[iVar61 + iVar17];
          }
          if ((0 < iVar44) && (0 < iVar56)) {
            fVar80 = pfVar8[iVar61 + iVar40];
          }
          auVar67 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar67);
          if ((0 < iVar45) && (0 < iVar43)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar34 + iVar17]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar67);
          if ((0 < iVar45) && (0 < iVar56)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar34 + iVar40]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar67);
          if ((0 < iVar60) && (0 < iVar43)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar17 + iVar36]);
          }
          if ((0 < iVar60) && (0 < iVar56)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar40 + iVar36]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          in_ZMM20 = ZEXT1664(auVar67);
          auVar68 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar68);
          if ((0 < iVar37) && (0 < iVar22)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar35 + iVar59]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar68);
          if ((0 < iVar37) && (0 < iVar23)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar35 + iVar18]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar68);
          auVar68 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar68);
          if ((0 < iVar44) && (0 < iVar22)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar59 + iVar61]);
          }
          if ((0 < iVar44) && (0 < iVar23)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar18 + iVar61]);
          }
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((fVar76 - fVar74) - fVar77))),
                               ZEXT816(0) << 0x40);
          auVar71 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
          auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
          auVar69 = vmaxss_avx512f(auVar69,auVar67);
          auVar67 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar67 = vsubss_avx512f(auVar67,in_ZMM24._0_16_);
          auVar67 = vaddss_avx512f(auVar67,in_ZMM23._0_16_);
          auVar67 = vmaxss_avx(auVar67,ZEXT816(0) << 0x40);
          fVar76 = fVar72 * auVar73._0_4_;
          fVar74 = fVar72 * auVar9._0_4_;
          fVar77 = fVar72 * (((auVar68._0_4_ + auVar71._0_4_) - auVar69._0_4_) - auVar67._0_4_);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77 * -0.81)),ZEXT416((uint)fVar76),
                                    ZEXT416((uint)fVar74));
          pfVar6[lVar66] = auVar73._0_4_;
          pbVar7[lVar66] = 0.0 <= fVar76 + fVar74;
          lVar66 = lVar66 + 1;
          lVar54 = lVar54 + lVar62;
          iVar16 = iVar16 + iVar2;
        } while (lVar54 < iVar15);
      }
      auVar70 = in_ZMM20._0_16_;
      uVar39 = uVar39 + lVar62;
      iVar63 = iVar63 + iVar46;
      iVar48 = iVar48 + iVar46;
      iVar28 = iVar28 + iVar46;
      iVar50 = iVar50 + iVar46;
      iVar27 = iVar27 + iVar46;
    } while ((long)uVar39 < (long)(ulong)uVar10);
  }
  iVar51 = (uVar10 - 1) + iVar2;
  iVar51 = iVar51 - iVar51 % iVar2;
  iVar20 = iVar20 * iVar2;
  if (iVar51 < iVar20) {
    auVar70 = vxorps_avx512vl(auVar70,auVar70);
    do {
      if (0 < iVar15) {
        iVar48 = iVar51 - uVar10;
        iVar47 = iimage->height;
        iVar50 = iVar48 + 1;
        if (iVar47 < iVar48 + 1) {
          iVar50 = iVar47;
        }
        iVar27 = uVar10 * 2 + iVar48;
        if (iVar47 <= iVar27) {
          iVar27 = iVar47;
        }
        iVar49 = (iVar50 + -1) * iVar1;
        iVar42 = (iVar27 + -1) * iVar1;
        iVar46 = iVar51 - uVar13;
        iVar14 = iVar46;
        if (iVar47 < iVar46) {
          iVar14 = iVar47;
        }
        iVar63 = iVar46 + iVar3;
        if (iVar47 <= iVar46 + iVar3) {
          iVar63 = iVar47;
        }
        iVar28 = (iVar14 + -1) * iVar1;
        iVar38 = (iVar63 + -1) * iVar1;
        iVar58 = iVar51 - uVar11;
        iVar46 = iVar58;
        if (iVar47 < iVar58) {
          iVar46 = iVar47;
        }
        iVar19 = iVar58 + uVar10;
        if (iVar47 <= (int)(iVar58 + uVar10)) {
          iVar19 = iVar47;
        }
        iVar16 = (iVar46 + -1) * iVar1;
        iVar58 = (iVar19 + -1) * iVar1;
        if (iVar47 < iVar48) {
          iVar48 = iVar47;
        }
        iVar44 = iVar47;
        if (iVar51 < iVar47) {
          iVar44 = iVar51;
        }
        iVar29 = (iVar48 + -1) * iVar1;
        iVar52 = (iVar44 + -1) * iVar1;
        iVar30 = iVar51 + 1;
        if (iVar47 < iVar51 + 1) {
          iVar30 = iVar47;
        }
        iVar25 = iVar51 + 1 + uVar10;
        if (iVar25 < iVar47) {
          iVar47 = iVar25;
        }
        iVar25 = (iVar30 + -1) * iVar1;
        iVar31 = (iVar47 + -1) * iVar1;
        lVar62 = (long)((iVar51 / iVar2) * iVar4);
        iVar45 = 0;
        do {
          iVar33 = iVar45 - uVar13;
          if (iVar5 < (int)(iVar45 - uVar13)) {
            iVar33 = iVar5;
          }
          iVar32 = (iVar3 - uVar13) + iVar45;
          if (iVar5 <= iVar32) {
            iVar32 = iVar5;
          }
          fVar74 = 0.0;
          fVar76 = 0.0;
          if ((0 < iVar50) && (0 < iVar33)) {
            fVar76 = pfVar8[iVar49 + iVar33 + -1];
          }
          if ((0 < iVar50) && (0 < iVar32)) {
            fVar74 = pfVar8[iVar49 + iVar32 + -1];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar27) && (0 < iVar33)) {
            fVar77 = pfVar8[iVar33 + -1 + iVar42];
          }
          if ((0 < iVar27) && (0 < iVar32)) {
            fVar75 = pfVar8[iVar32 + -1 + iVar42];
          }
          iVar33 = iVar45 - uVar11;
          if (iVar5 < (int)(iVar45 - uVar11)) {
            iVar33 = iVar5;
          }
          iVar32 = (uVar10 - uVar11) + iVar45;
          if (iVar5 <= iVar32) {
            iVar32 = iVar5;
          }
          auVar73 = ZEXT816(0) << 0x40;
          fVar78 = 0.0;
          if ((0 < iVar50) && (0 < iVar33)) {
            fVar78 = pfVar8[iVar49 + iVar33 + -1];
          }
          fVar79 = 0.0;
          if ((0 < iVar50) && (0 < iVar32)) {
            fVar79 = pfVar8[iVar49 + iVar32 + -1];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar27) && (0 < iVar33)) {
            fVar81 = pfVar8[iVar33 + -1 + iVar42];
          }
          if ((0 < iVar27) && (0 < iVar32)) {
            fVar80 = pfVar8[iVar32 + -1 + iVar42];
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),auVar73);
          iVar33 = -uVar10 + 1 + iVar45;
          if (iVar5 < iVar33) {
            iVar33 = iVar5;
          }
          iVar53 = iVar33 + -1;
          iVar32 = uVar10 + iVar45;
          if (iVar5 <= (int)(uVar10 + iVar45)) {
            iVar32 = iVar5;
          }
          fVar74 = 0.0;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar67,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar76 = 0.0;
          if ((0 < iVar14) && (0 < iVar33)) {
            fVar76 = pfVar8[iVar28 + iVar53];
          }
          iVar60 = iVar32 + -1;
          if ((0 < iVar14) && (0 < iVar32)) {
            fVar74 = pfVar8[iVar28 + iVar60];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar63) && (0 < iVar33)) {
            fVar77 = pfVar8[iVar38 + iVar53];
          }
          if ((0 < iVar63) && (0 < iVar32)) {
            fVar75 = pfVar8[iVar38 + iVar60];
          }
          if ((0 < iVar46) && (0 < iVar33)) {
            auVar73 = ZEXT416((uint)pfVar8[iVar16 + iVar53]);
          }
          fVar78 = 0.0;
          if ((0 < iVar46) && (0 < iVar32)) {
            fVar78 = pfVar8[iVar16 + iVar60];
          }
          fVar81 = 0.0;
          fVar79 = 0.0;
          if ((0 < iVar19) && (0 < iVar33)) {
            fVar79 = pfVar8[iVar53 + iVar58];
          }
          if ((0 < iVar19) && (0 < iVar32)) {
            fVar81 = pfVar8[iVar60 + iVar58];
          }
          auVar67 = vmaxss_avx(ZEXT416((uint)(((fVar76 - fVar74) - fVar77) + fVar75)),
                               ZEXT816(0) << 0x40);
          iVar33 = iVar45 + 1;
          if (iVar5 < iVar45 + 1) {
            iVar33 = iVar5;
          }
          iVar53 = iVar33 + -1;
          iVar32 = iVar45 + 1 + uVar10;
          if (iVar5 <= iVar32) {
            iVar32 = iVar5;
          }
          fVar74 = 0.0;
          auVar73 = vmaxss_avx(ZEXT416((uint)(fVar81 + ((auVar73._0_4_ - fVar78) - fVar79))),
                               ZEXT816(0) << 0x40);
          auVar73 = vfmadd132ss_fma(auVar73,auVar67,SUB6416(ZEXT464(0xc0400000),0));
          fVar76 = 0.0;
          if ((0 < iVar48) && (0 < iVar33)) {
            fVar76 = pfVar8[iVar29 + iVar53];
          }
          iVar60 = iVar32 + -1;
          if ((0 < iVar48) && (0 < iVar32)) {
            fVar74 = pfVar8[iVar29 + iVar60];
          }
          fVar75 = 0.0;
          fVar77 = 0.0;
          if ((0 < iVar44) && (0 < iVar33)) {
            fVar77 = pfVar8[iVar52 + iVar53];
          }
          if ((0 < iVar44) && (0 < iVar32)) {
            fVar75 = pfVar8[iVar52 + iVar60];
          }
          iVar37 = -uVar10 + iVar45;
          if (iVar5 < iVar37) {
            iVar37 = iVar5;
          }
          iVar34 = iVar37 + -1;
          iVar36 = iVar5;
          if (iVar45 < iVar5) {
            iVar36 = iVar45;
          }
          fVar78 = 0.0;
          if ((0 < iVar30) && (0 < iVar37)) {
            fVar78 = pfVar8[iVar25 + iVar34];
          }
          iVar35 = iVar36 + -1;
          fVar79 = 0.0;
          if ((0 < iVar30) && (0 < iVar36)) {
            fVar79 = pfVar8[iVar25 + iVar35];
          }
          fVar80 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar47) && (0 < iVar37)) {
            fVar81 = pfVar8[iVar31 + iVar34];
          }
          if ((0 < iVar47) && (0 < iVar36)) {
            fVar80 = pfVar8[iVar31 + iVar35];
          }
          auVar67 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar67);
          if ((0 < iVar48) && (0 < iVar37)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar29 + iVar34]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar67);
          if ((0 < iVar48) && (0 < iVar36)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar29 + iVar35]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar67);
          if ((0 < iVar44) && (0 < iVar37)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar34 + iVar52]);
          }
          if ((0 < iVar44) && (0 < iVar36)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar35 + iVar52]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar67);
          if ((0 < iVar30) && (0 < iVar33)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar25 + iVar53]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar67);
          if ((0 < iVar30) && (0 < iVar32)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar25 + iVar60]);
          }
          auVar67 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar67);
          auVar67 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar67);
          if ((0 < iVar47) && (0 < iVar33)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar53 + iVar31]);
          }
          if ((0 < iVar47) && (0 < iVar32)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar60 + iVar31]);
          }
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar75 + ((fVar76 - fVar74) - fVar77))),
                               ZEXT816(0) << 0x40);
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar80 + ((fVar78 - fVar79) - fVar81))),
                               ZEXT816(0) << 0x40);
          auVar71 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar71 = vsubss_avx512f(auVar71,in_ZMM19._0_16_);
          auVar71 = vaddss_avx512f(auVar71,in_ZMM18._0_16_);
          auVar69 = vmaxss_avx512f(auVar71,auVar70);
          auVar71 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar71 = vsubss_avx512f(auVar71,in_ZMM24._0_16_);
          auVar71 = vaddss_avx512f(auVar71,in_ZMM23._0_16_);
          auVar71 = vmaxss_avx(auVar71,ZEXT816(0) << 0x40);
          fVar76 = fVar72 * auVar9._0_4_;
          fVar74 = fVar72 * auVar73._0_4_;
          fVar77 = fVar72 * (((auVar67._0_4_ + auVar68._0_4_) - auVar69._0_4_) - auVar71._0_4_);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar77 * fVar77 * -0.81)),ZEXT416((uint)fVar76),
                                    ZEXT416((uint)fVar74));
          pfVar6[lVar62] = auVar73._0_4_;
          pbVar7[lVar62] = 0.0 <= fVar76 + fVar74;
          lVar62 = lVar62 + 1;
          iVar45 = iVar45 + iVar2;
        } while (iVar45 < iVar15);
      }
      iVar51 = iVar51 + iVar2;
    } while (iVar51 < iVar20);
  }
  return;
}

Assistant:

void compute_response_layer_Dxx_top(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_Dxx_leftcorner

        optimization:
        - Dxx box filter hand optimized and split into cases (here only top)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dxx0, Dxx1;
    float A, B, C, D;
    int k, k0;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    k = (lobe / 2 + 1 + step - 1) / step * step;

    // Top Left Corner
    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width;

        // Case 1: C of neg part outside
        for (int j = 0; j < lobe / 2 + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            D = data[r11 * data_width + c11];
            Dxx1 = D;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: B of neg part inside
        // initial value has to be rounded up to next bigger step
        for (int j = k; j < border + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid
    k = (border + 1 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step - border; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;
            c01 = y + border;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) -
                  box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right
    k = (width * step - border + step - 1) / step * step;
    k0 = (width * step - lobe / 2 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        // Case 1: D of neg part inside
        for (int j = k; j < width * step - lobe / 2; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: D of neg part outside
        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}